

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O1

bool __thiscall ON_Buffer::IsValid(ON_Buffer *this,ON_TextLog *text_log)

{
  ulong uVar1;
  ON_BUFFER_SEGMENT *pOVar2;
  ON_BUFFER_SEGMENT *pOVar3;
  ON_BUFFER_SEGMENT *pOVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ON_BUFFER_SEGMENT *pOVar8;
  
  uVar1 = this->m_buffer_size;
  pOVar2 = this->m_first_segment;
  if (uVar1 == 0) {
    if (pOVar2 == (ON_BUFFER_SEGMENT *)0x0 && this->m_last_segment == (ON_BUFFER_SEGMENT *)0x0) {
      return this->m_current_segment == (ON_BUFFER_SEGMENT *)0x0;
    }
  }
  else if ((((pOVar2 != (ON_BUFFER_SEGMENT *)0x0) &&
            (pOVar2->m_prev_segment == (ON_BUFFER_SEGMENT *)0x0)) &&
           (pOVar3 = this->m_last_segment, pOVar3 != (ON_BUFFER_SEGMENT *)0x0)) &&
          (pOVar3->m_next_segment == (ON_BUFFER_SEGMENT *)0x0)) {
    uVar5 = 0;
    pOVar8 = (ON_BUFFER_SEGMENT *)0x0;
    do {
      pOVar4 = pOVar2;
      if (pOVar8 != pOVar4->m_prev_segment) {
        return false;
      }
      if ((pOVar8 != (ON_BUFFER_SEGMENT *)0x0) &&
         (pOVar8->m_segment_position1 != pOVar4->m_segment_position0)) {
        return false;
      }
      uVar7 = pOVar4->m_segment_position0;
      lVar6 = pOVar4->m_segment_position1 - uVar7;
      if (pOVar4->m_segment_position1 < uVar7 || lVar6 == 0) {
        return false;
      }
      if (uVar5 != uVar7) {
        return false;
      }
      uVar7 = lVar6 + uVar5;
      if (uVar7 <= uVar5) {
        return false;
      }
      pOVar2 = pOVar4->m_next_segment;
      uVar5 = uVar7;
      pOVar8 = pOVar4;
    } while (pOVar4->m_next_segment != (ON_BUFFER_SEGMENT *)0x0);
    if (((uVar1 <= uVar7 && pOVar3 == pOVar4) && (pOVar3->m_segment_position0 < uVar1)) &&
       (uVar1 <= pOVar3->m_segment_position1)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_Buffer::IsValid( const ON_TextLog* text_log ) const
{
  // This function is primarily used to discover bugs
  // in the ON_Buffer member function code.

  if ( 0 == m_buffer_size )
  {

    if ( 0 != m_first_segment )
      return ON_Buffer_IsNotValid();
    if ( 0 != m_last_segment )
      return ON_Buffer_IsNotValid();
    if ( 0 != m_current_segment )
      return ON_Buffer_IsNotValid();

    return true;
  }


  if ( 0 == m_first_segment )
    return ON_Buffer_IsNotValid();
  if ( 0 != m_first_segment->m_prev_segment )
    return ON_Buffer_IsNotValid();
  if ( 0 == m_last_segment )
    return ON_Buffer_IsNotValid();
  if ( 0 != m_last_segment->m_next_segment )
    return ON_Buffer_IsNotValid();

  bool bCurrentSegInList = (0 == m_current_segment);
  ON__UINT64 pos = 0;
  ON__UINT64 u;
  const struct ON_BUFFER_SEGMENT* prev_seg = 0;
  const struct ON_BUFFER_SEGMENT* seg;
  for ( seg = m_first_segment; seg != 0; seg = seg->m_next_segment )
  {
    if ( prev_seg != seg->m_prev_segment )
      return ON_Buffer_IsNotValid();
    if ( 0 != prev_seg && prev_seg->m_segment_position1 != seg->m_segment_position0 )
      return ON_Buffer_IsNotValid();
    if ( seg->m_segment_position1 <= seg->m_segment_position0 )
      return ON_Buffer_IsNotValid();
    if ( pos != seg->m_segment_position0 )
      return ON_Buffer_IsNotValid();

    if ( m_current_segment == seg )
      bCurrentSegInList = true;

    // pos checks prevent infinite loop when the linked list has a cycle;
    u = pos + (seg->m_segment_position1 - seg->m_segment_position0);
    if ( pos >= u )
      return ON_Buffer_IsNotValid(); // addition wrapped value
    pos = u;
    prev_seg = seg;
  }

  if ( m_last_segment != prev_seg )
    return ON_Buffer_IsNotValid();

  if ( pos < m_buffer_size )
    return ON_Buffer_IsNotValid();

  if (    m_buffer_size <= m_last_segment->m_segment_position0 
       || m_buffer_size > m_last_segment->m_segment_position1 
     )
    return ON_Buffer_IsNotValid();

  return true;
}